

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int nocaseCollatingFunc(void *NotUsed,int nKey1,void *pKey1,int nKey2,void *pKey2)

{
  int local_4c;
  int local_34;
  int r;
  void *pKey2_local;
  int nKey2_local;
  void *pKey1_local;
  int nKey1_local;
  void *NotUsed_local;
  
  local_4c = nKey2;
  if (nKey1 < nKey2) {
    local_4c = nKey1;
  }
  local_34 = sqlite3_strnicmp((char *)pKey1,(char *)pKey2,local_4c);
  if (local_34 == 0) {
    local_34 = nKey1 - nKey2;
  }
  return local_34;
}

Assistant:

static int nocaseCollatingFunc(
  void *NotUsed,
  int nKey1, const void *pKey1,
  int nKey2, const void *pKey2
){
  int r = sqlite3StrNICmp(
      (const char *)pKey1, (const char *)pKey2, (nKey1<nKey2)?nKey1:nKey2);
  UNUSED_PARAMETER(NotUsed);
  if( 0==r ){
    r = nKey1-nKey2;
  }
  return r;
}